

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_mp3_get_mp3_and_pcm_frame_count
                    (ma_dr_mp3 *pMP3,ma_uint64 *pMP3FrameCount,ma_uint64 *pPCMFrameCount)

{
  ma_bool32 mVar1;
  ma_uint32 mVar2;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  ma_uint32 pcmFramesInCurrentMP3Frame;
  ma_uint64 totalMP3FrameCount;
  ma_uint64 totalPCMFrameCount;
  ma_uint64 currentPCMFrame;
  ma_dr_mp3 *in_stack_ffffffffffffffb8;
  undefined8 local_38;
  undefined8 local_30;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = 0;
  }
  else if (*(long *)(in_RDI + 0x1a20) == 0) {
    local_4 = 0;
  }
  else {
    mVar1 = ma_dr_mp3_seek_to_start_of_stream(in_stack_ffffffffffffffb8);
    if (mVar1 == 0) {
      local_4 = 0;
    }
    else {
      local_30 = 0;
      local_38 = 0;
      while( true ) {
        mVar2 = ma_dr_mp3_decode_next_frame_ex
                          (in_stack_ffffffffffffffb8,(ma_dr_mp3d_sample_t *)0x2592e1);
        if (mVar2 == 0) break;
        local_30 = (ulong)mVar2 + local_30;
        local_38 = local_38 + 1;
      }
      mVar1 = ma_dr_mp3_seek_to_start_of_stream(in_stack_ffffffffffffffb8);
      if (mVar1 == 0) {
        local_4 = 0;
      }
      else {
        mVar1 = ma_dr_mp3_seek_to_pcm_frame(in_stack_ffffffffffffffb8,0x259334);
        if (mVar1 == 0) {
          local_4 = 0;
        }
        else {
          if (in_RSI != (long *)0x0) {
            *in_RSI = local_38;
          }
          if (in_RDX != (long *)0x0) {
            *in_RDX = local_30;
          }
          local_4 = 1;
        }
      }
    }
  }
  return local_4;
}

Assistant:

MA_API ma_bool32 ma_dr_mp3_get_mp3_and_pcm_frame_count(ma_dr_mp3* pMP3, ma_uint64* pMP3FrameCount, ma_uint64* pPCMFrameCount)
{
    ma_uint64 currentPCMFrame;
    ma_uint64 totalPCMFrameCount;
    ma_uint64 totalMP3FrameCount;
    if (pMP3 == NULL) {
        return MA_FALSE;
    }
    if (pMP3->onSeek == NULL) {
        return MA_FALSE;
    }
    currentPCMFrame = pMP3->currentPCMFrame;
    if (!ma_dr_mp3_seek_to_start_of_stream(pMP3)) {
        return MA_FALSE;
    }
    totalPCMFrameCount = 0;
    totalMP3FrameCount = 0;
    for (;;) {
        ma_uint32 pcmFramesInCurrentMP3Frame;
        pcmFramesInCurrentMP3Frame = ma_dr_mp3_decode_next_frame_ex(pMP3, NULL);
        if (pcmFramesInCurrentMP3Frame == 0) {
            break;
        }
        totalPCMFrameCount += pcmFramesInCurrentMP3Frame;
        totalMP3FrameCount += 1;
    }
    if (!ma_dr_mp3_seek_to_start_of_stream(pMP3)) {
        return MA_FALSE;
    }
    if (!ma_dr_mp3_seek_to_pcm_frame(pMP3, currentPCMFrame)) {
        return MA_FALSE;
    }
    if (pMP3FrameCount != NULL) {
        *pMP3FrameCount = totalMP3FrameCount;
    }
    if (pPCMFrameCount != NULL) {
        *pPCMFrameCount = totalPCMFrameCount;
    }
    return MA_TRUE;
}